

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::OptionsSingleIn::process
          (OptionsSingleIn *this,Options *param_2,ParseResult *args,Reporter *report)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ParseResult *in_RDX;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe50;
  ParseResult *in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe60;
  ParseResult *pPVar5;
  char *in_stack_fffffffffffffe68;
  _Alloc_hider *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  OptionValue *this_00;
  char (*in_stack_fffffffffffffe90) [70];
  Reporter *in_stack_fffffffffffffe98;
  Reporter *this_01;
  allocator<char> local_119;
  string local_118 [39];
  undefined1 local_f1 [40];
  undefined1 local_c9 [40];
  undefined1 local_a1 [40];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [40];
  ParseResult *local_18;
  
  local_18 = in_RDX;
  cxxopts::ParseResult::unmatched_abi_cxx11_(in_RDX);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffe40);
  if (!bVar1) {
    Reporter::fatal_usage<char_const(&)[30]>
              (in_stack_fffffffffffffe98,(char (*) [30])in_stack_fffffffffffffe90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  sVar2 = cxxopts::ParseResult::count(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  sVar3 = cxxopts::ParseResult::count(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar2 + sVar3 == 0) {
    Reporter::fatal_usage<char_const(&)[70]>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  this_01 = (Reporter *)local_a1;
  pPVar5 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  sVar2 = cxxopts::ParseResult::count(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  this_00 = (OptionValue *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cxxopts::ParseResult::count(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  __s = &pbVar4->_M_dataplus + sVar2;
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  if ((_Alloc_hider *)0x1 < __s) {
    Reporter::fatal_usage<char_const(&)[78]>(this_01,(char (*) [78])pPVar5);
  }
  pPVar5 = (ParseResult *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar4,(char *)__s,(allocator<char> *)pPVar5);
  sVar2 = cxxopts::ParseResult::count(local_18,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar4,(char *)__s,(allocator<char> *)pPVar5)
    ;
    cxxopts::ParseResult::operator[](pPVar5,(string *)local_18);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    std::__cxx11::string::operator=(in_RDI,(string *)pbVar4);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    std::__cxx11::string::operator=(in_RDI,"-");
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (!args.unmatched().empty())
            report.fatal_usage("Too many filenames specified.");

        if (args.count("stdin") + args.count("input-file") == 0)
            report.fatal_usage("Missing input file. Either <input-file> or --stdin must be specified.");
        if (args.count("stdin") + args.count("input-file") > 1)
            report.fatal_usage("Conflicting options: Only one can be specified from <input-file> and --stdin.");

        if (args.count("stdin"))
            inputFilepath = "-";
        else
            inputFilepath = args["input-file"].as<std::string>();
    }